

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinRoboKin_dns.c
# Opt level: O0

int func(N_Vector y,N_Vector f,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double *pdVar25;
  double *pdVar26;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sunrealtype ub8;
  sunrealtype ub7;
  sunrealtype ub6;
  sunrealtype ub5;
  sunrealtype ub4;
  sunrealtype ub3;
  sunrealtype ub2;
  sunrealtype ub1;
  sunrealtype lb8;
  sunrealtype lb7;
  sunrealtype lb6;
  sunrealtype lb5;
  sunrealtype lb4;
  sunrealtype lb3;
  sunrealtype lb2;
  sunrealtype lb1;
  sunrealtype eq8;
  sunrealtype eq7;
  sunrealtype eq6;
  sunrealtype eq5;
  sunrealtype eq4;
  sunrealtype eq3;
  sunrealtype eq2;
  sunrealtype eq1;
  sunrealtype u8;
  sunrealtype u7;
  sunrealtype u6;
  sunrealtype u5;
  sunrealtype u4;
  sunrealtype u3;
  sunrealtype u2;
  sunrealtype u1;
  sunrealtype l8;
  sunrealtype l7;
  sunrealtype l6;
  sunrealtype l5;
  sunrealtype l4;
  sunrealtype l3;
  sunrealtype l2;
  sunrealtype l1;
  sunrealtype x8;
  sunrealtype x7;
  sunrealtype x6;
  sunrealtype x5;
  sunrealtype x4;
  sunrealtype x3;
  sunrealtype x2;
  sunrealtype x1;
  sunrealtype *fd;
  sunrealtype *yd;
  
  pdVar25 = (double *)N_VGetArrayPointer(in_RDI);
  pdVar26 = (double *)N_VGetArrayPointer(in_RSI);
  dVar1 = *pdVar25;
  dVar2 = pdVar25[8];
  dVar3 = pdVar25[0x10];
  dVar4 = pdVar25[1];
  dVar5 = pdVar25[9];
  dVar6 = pdVar25[0x11];
  dVar7 = pdVar25[2];
  dVar8 = pdVar25[10];
  dVar9 = pdVar25[0x12];
  dVar10 = pdVar25[3];
  dVar11 = pdVar25[0xb];
  dVar12 = pdVar25[0x13];
  dVar13 = pdVar25[4];
  dVar14 = pdVar25[0xc];
  dVar15 = pdVar25[0x14];
  dVar16 = pdVar25[5];
  dVar17 = pdVar25[0xd];
  dVar18 = pdVar25[0x15];
  dVar19 = pdVar25[6];
  dVar20 = pdVar25[0xe];
  dVar21 = pdVar25[0x16];
  dVar22 = pdVar25[7];
  dVar23 = pdVar25[0xf];
  dVar24 = pdVar25[0x17];
  *pdVar26 = (-(dVar4 * 0.3578) * dVar7 +
             dVar1 * 0.004731 * dVar7 +
             dVar10 * -0.9338 + dVar4 * -0.001637 + dVar1 * -0.1238 + dVar19) - 0.3571;
  pdVar26[8] = (dVar2 - 1.0) - dVar1;
  pdVar26[0x10] = (dVar3 - 1.0) + dVar1;
  pdVar26[1] = (dVar4 * 0.7623 * dVar7 +
               dVar1 * 0.2238 * dVar7 +
               dVar10 * -0.6734 + dVar4 * -0.07745 + dVar1 * 0.2638 + -dVar19) - 0.6022;
  pdVar26[9] = (dVar5 - 1.0) - dVar4;
  pdVar26[0x11] = (dVar6 - 1.0) + dVar4;
  pdVar26[2] = dVar16 * dVar22 + dVar1 * 0.3578 + dVar4 * 0.004731;
  pdVar26[10] = (dVar8 - 1.0) - dVar7;
  pdVar26[0x12] = (dVar9 - 1.0) + dVar7;
  pdVar26[3] = dVar1 * -0.7623 + dVar4 * 0.2238 + 0.3461;
  pdVar26[0xb] = (dVar11 - 1.0) - dVar10;
  pdVar26[0x13] = (dVar12 - 1.0) + dVar10;
  pdVar26[4] = (dVar1 * dVar1 + dVar4 * dVar4) - 1.0;
  pdVar26[0xc] = (dVar14 - 1.0) - dVar13;
  pdVar26[0x14] = (dVar15 - 1.0) + dVar13;
  pdVar26[5] = (dVar7 * dVar7 + dVar10 * dVar10) - 1.0;
  pdVar26[0xd] = (dVar17 - 1.0) - dVar16;
  pdVar26[0x15] = (dVar18 - 1.0) + dVar16;
  pdVar26[6] = (dVar13 * dVar13 + dVar16 * dVar16) - 1.0;
  pdVar26[0xe] = (dVar20 - 1.0) - dVar19;
  pdVar26[0x16] = (dVar21 - 1.0) + dVar19;
  pdVar26[7] = (dVar19 * dVar19 + dVar22 * dVar22) - 1.0;
  pdVar26[0xf] = (dVar23 - 1.0) - dVar22;
  pdVar26[0x17] = (dVar24 - 1.0) + dVar22;
  return 0;
}

Assistant:

static int func(N_Vector y, N_Vector f, void* user_data)
{
  sunrealtype *yd, *fd;

  sunrealtype x1, x2, x3, x4, x5, x6, x7, x8;
  sunrealtype l1, l2, l3, l4, l5, l6, l7, l8;
  sunrealtype u1, u2, u3, u4, u5, u6, u7, u8;

  sunrealtype eq1, eq2, eq3, eq4, eq5, eq6, eq7, eq8;
  sunrealtype lb1, lb2, lb3, lb4, lb5, lb6, lb7, lb8;
  sunrealtype ub1, ub2, ub3, ub4, ub5, ub6, ub7, ub8;

  yd = N_VGetArrayPointer(y);
  fd = N_VGetArrayPointer(f);

  x1 = yd[0];
  l1 = yd[8];
  u1 = yd[16];
  x2 = yd[1];
  l2 = yd[9];
  u2 = yd[17];
  x3 = yd[2];
  l3 = yd[10];
  u3 = yd[18];
  x4 = yd[3];
  l4 = yd[11];
  u4 = yd[19];
  x5 = yd[4];
  l5 = yd[12];
  u5 = yd[20];
  x6 = yd[5];
  l6 = yd[13];
  u6 = yd[21];
  x7 = yd[6];
  l7 = yd[14];
  u7 = yd[22];
  x8 = yd[7];
  l8 = yd[15];
  u8 = yd[23];

  /* Nonlinear equations */

  eq1 = -0.1238 * x1 + x7 - 0.001637 * x2 - 0.9338 * x4 + 0.004731 * x1 * x3 -
        0.3578 * x2 * x3 - 0.3571;
  eq2 = 0.2638 * x1 - x7 - 0.07745 * x2 - 0.6734 * x4 + 0.2238 * x1 * x3 +
        0.7623 * x2 * x3 - 0.6022;
  eq3 = 0.3578 * x1 + 0.004731 * x2 + x6 * x8;
  eq4 = -0.7623 * x1 + 0.2238 * x2 + 0.3461;
  eq5 = x1 * x1 + x2 * x2 - 1;
  eq6 = x3 * x3 + x4 * x4 - 1;
  eq7 = x5 * x5 + x6 * x6 - 1;
  eq8 = x7 * x7 + x8 * x8 - 1;

  /* Lower bounds ( l_i = 1 + x_i >= 0)*/

  lb1 = l1 - 1.0 - x1;
  lb2 = l2 - 1.0 - x2;
  lb3 = l3 - 1.0 - x3;
  lb4 = l4 - 1.0 - x4;
  lb5 = l5 - 1.0 - x5;
  lb6 = l6 - 1.0 - x6;
  lb7 = l7 - 1.0 - x7;
  lb8 = l8 - 1.0 - x8;

  /* Upper bounds ( u_i = 1 - x_i >= 0)*/

  ub1 = u1 - 1.0 + x1;
  ub2 = u2 - 1.0 + x2;
  ub3 = u3 - 1.0 + x3;
  ub4 = u4 - 1.0 + x4;
  ub5 = u5 - 1.0 + x5;
  ub6 = u6 - 1.0 + x6;
  ub7 = u7 - 1.0 + x7;
  ub8 = u8 - 1.0 + x8;

  fd[0]  = eq1;
  fd[8]  = lb1;
  fd[16] = ub1;
  fd[1]  = eq2;
  fd[9]  = lb2;
  fd[17] = ub2;
  fd[2]  = eq3;
  fd[10] = lb3;
  fd[18] = ub3;
  fd[3]  = eq4;
  fd[11] = lb4;
  fd[19] = ub4;
  fd[4]  = eq5;
  fd[12] = lb5;
  fd[20] = ub5;
  fd[5]  = eq6;
  fd[13] = lb6;
  fd[21] = ub6;
  fd[6]  = eq7;
  fd[14] = lb7;
  fd[22] = ub7;
  fd[7]  = eq8;
  fd[15] = lb8;
  fd[23] = ub8;

  return (0);
}